

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O0

_Type_BOOLEAN * __thiscall
LiteScript::_Type_BOOLEAN::ToString_abi_cxx11_(_Type_BOOLEAN *this,Variable *obj)

{
  Object *this_00;
  bool *pbVar1;
  char *pcVar2;
  Variable *in_RDX;
  allocator local_21 [9];
  Variable *obj_local;
  _Type_BOOLEAN *this_local;
  
  obj_local = obj;
  this_local = this;
  this_00 = Variable::operator->(in_RDX);
  pbVar1 = Object::GetData<bool>(this_00);
  pcVar2 = "false";
  if ((*pbVar1 & 1U) != 0) {
    pcVar2 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar2,local_21);
  std::allocator<char>::~allocator((allocator<char> *)local_21);
  return this;
}

Assistant:

std::string LiteScript::_Type_BOOLEAN::ToString(const LiteScript::Variable & obj) const {
    return ((obj->GetData<bool>()) ? "true" : "false");
}